

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

void __thiscall
rsg::ValueScope::setValue(ValueScope *this,Variable *variable,ConstValueRangeAccess value)

{
  ValueEntry *pVVar1;
  pointer pSVar2;
  pointer pSVar3;
  int iVar4;
  __normal_iterator<rsg::ValueEntry_*const_*,_std::vector<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>_>
  _Var5;
  pointer __dest;
  pointer pSVar6;
  
  _Var5 = std::
          __find_if<__gnu_cxx::__normal_iterator<rsg::ValueEntry*const*,std::vector<rsg::ValueEntry*,std::allocator<rsg::ValueEntry*>>>,__gnu_cxx::__ops::_Iter_equals_val<rsg::CompareEntryVariable_const>>
                    ((this->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->m_entries).
                     super__Vector_base<rsg::ValueEntry_*,_std::allocator<rsg::ValueEntry_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  pVVar1 = *_Var5._M_current;
  pSVar2 = (pVVar1->m_valueRange).m_min.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar6 = (pVVar1->m_valueRange).m_max.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (pVVar1->m_valueRange).m_min.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __dest = (pointer)0x0;
  if (pSVar6 != (pVVar1->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    __dest = pSVar6;
  }
  iVar4 = VariableType::getScalarSize(&(pVVar1->m_valueRange).m_type);
  if (iVar4 != 0) {
    pSVar6 = (pointer)0x0;
    if (pSVar2 != pSVar3) {
      pSVar6 = pSVar2;
    }
    memmove(pSVar6,value.m_min,(long)iVar4 << 2);
  }
  iVar4 = VariableType::getScalarSize(&(pVVar1->m_valueRange).m_type);
  if (iVar4 != 0) {
    memmove(__dest,value.m_max,(long)iVar4 << 2);
  }
  return;
}

Assistant:

void ValueScope::setValue (const Variable* variable, ConstValueRangeAccess value)
{
	ValueEntry* entry = findEntry(variable);
	DE_ASSERT(entry);

	ValueRangeAccess dst = entry->getValueRange();
	dst.getMin() = value.getMin().value();
	dst.getMax() = value.getMax().value();
}